

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O2

void __thiscall pstack::JSONEncodingError::~JSONEncodingError(JSONEncodingError *this)

{
  *(undefined ***)this = &PTR__JSONEncodingError_00151110;
  std::__cxx11::string::~string((string *)&this->msg);
  std::exception::~exception(&this->super_exception);
  return;
}

Assistant:

const char *what() const noexcept { return msg.c_str(); }